

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  int *piVar1;
  Enum EVar2;
  undefined8 *puVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  char *__dest;
  uint uVar10;
  ulong uVar11;
  String *pSVar12;
  IReporter **curr_rep;
  undefined8 *puVar13;
  anon_union_24_2_13149d16_for_String_2 *__s2;
  long in_FS_OFFSET;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  uint extraout_XMM0_Da_01;
  uint extraout_XMM0_Da_02;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  anon_union_24_2_13149d16_for_String_2 local_88;
  anon_union_24_2_13149d16_for_String_2 local_70;
  anon_union_24_2_13149d16_for_String_2 local_58;
  anon_union_24_2_13149d16_for_String_2 local_40;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as != true) {
        (this->super_AssertData).m_failed = true;
        goto LAB_00182d45;
      }
LAB_00182f4d:
      pcVar7 = (this->super_AssertData).m_exception_string;
      sVar9 = strlen(pcVar7);
      __dest = String::allocate((String *)&local_88.data,(uint)sVar9);
      memcpy(__dest,pcVar7,sVar9 & 0xffffffff);
      pcVar7 = (char *)CONCAT44(local_88._4_4_,local_88._0_4_);
      if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
        pSVar12 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
      }
      else {
        pSVar12 = &(this->super_AssertData).m_exception;
      }
      bVar5 = local_88.buf[0x17] < '\0';
      __s2 = &local_88;
      if (bVar5) {
        __s2 = (anon_union_24_2_13149d16_for_String_2 *)pcVar7;
      }
      iVar6 = strcmp((char *)pSVar12,__s2->buf);
      __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
      (this->super_AssertData).m_failed = iVar6 != 0;
      if (pcVar7 != (char *)0x0 && bVar5) {
        operator_delete__(pcVar7);
        __x = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
      }
      goto LAB_00182d45;
    }
    if ((EVar2 & is_throws_as) != 0) {
      bVar4 = (this->super_AssertData).m_threw_as;
      goto LAB_00182d40;
    }
    if ((EVar2 & is_throws_with) != 0) goto LAB_00182f4d;
    if (-1 < (char)EVar2) goto LAB_00182d45;
    bVar4 = (this->super_AssertData).m_threw;
  }
  else {
    bVar4 = (this->super_AssertData).m_threw;
LAB_00182d40:
    bVar4 = bVar4 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar4;
LAB_00182d45:
  bVar4 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar4 < '\0') {
    uVar10 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar10 = 0x17 - (bVar4 & 0x1f);
  }
  if (uVar10 != 0) {
    pSVar12 = &(this->super_AssertData).m_exception;
    pcVar7 = String::allocate((String *)&local_40.data,1);
    *pcVar7 = '\"';
    operator+((String *)&local_58.data,(String *)&local_40.data,pSVar12);
    pcVar7 = String::allocate((String *)&local_70.data,1);
    *pcVar7 = '\"';
    operator+((String *)&local_88.data,(String *)&local_58.data,(String *)&local_70.data);
    if (&pSVar12->field_0 == &local_88) {
      uVar14 = extraout_XMM0_Da;
      uVar15 = extraout_XMM0_Db;
      if ((local_88.buf[0x17] < '\0') &&
         ((void *)CONCAT44(local_88._4_4_,local_88._0_4_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT44(local_88._4_4_,local_88._0_4_));
        uVar14 = extraout_XMM0_Da_00;
        uVar15 = extraout_XMM0_Db_00;
      }
    }
    else {
      if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
         (pcVar7 = (pSVar12->field_0).data.ptr, pcVar7 != (char *)0x0)) {
        operator_delete__(pcVar7);
      }
      uVar14 = local_88._0_4_;
      *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
           CONCAT17(local_88.buf[0x17],local_88._16_7_);
      *(undefined4 *)&pSVar12->field_0 = local_88._0_4_;
      *(undefined4 *)((long)&(this->super_AssertData).m_exception.field_0 + 4) = local_88._4_4_;
      (this->super_AssertData).m_exception.field_0.data.size = local_88.data.size;
      (this->super_AssertData).m_exception.field_0.data.capacity = local_88.data.capacity;
      local_88._0_4_ = local_88._0_4_ & 0xffffff00;
      local_88.buf[0x17] = '\x17';
      uVar15 = local_88._4_4_;
    }
    if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
      operator_delete__(local_70.data.ptr);
      uVar14 = extraout_XMM0_Da_01;
      uVar15 = extraout_XMM0_Db_01;
    }
    if ((local_58.buf[0x17] < '\0') && (local_58.data.ptr != (char *)0x0)) {
      operator_delete__(local_58.data.ptr);
      uVar14 = extraout_XMM0_Da_02;
      uVar15 = extraout_XMM0_Db_02;
    }
    __x = (double)CONCAT44(uVar15,uVar14);
    if ((local_40.buf[0x17] < '\0') &&
       (__x = (double)CONCAT44(uVar15,uVar14), local_40.data.ptr != (char *)0x0)) {
      operator_delete__(local_40.data.ptr);
      __x = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    }
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar8 = g_cs + 0xb8;
      if (*(char *)(in_FS_OFFSET + -8) == '\0') {
        LOCK();
        UNLOCK();
        uVar11 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(in_FS_OFFSET + -0x10) = uVar11;
        *(undefined1 *)(in_FS_OFFSET + -8) = 1;
      }
      else {
        uVar11 = *(ulong *)(in_FS_OFFSET + -0x10);
      }
      LOCK();
      piVar1 = (int *)(lVar8 + uVar11 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar3 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar13 = *(undefined8 **)(g_cs + 0x10d0); puVar13 != puVar3; puVar13 = puVar13 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar13 + 0x48))((long *)*puVar13,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar8 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -8) == '\0') {
        LOCK();
        UNLOCK();
        uVar11 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(in_FS_OFFSET + -0x10) = uVar11;
        *(undefined1 *)(in_FS_OFFSET + -8) = 1;
      }
      else {
        uVar11 = *(ulong *)(in_FS_OFFSET + -0x10);
      }
      LOCK();
      piVar1 = (int *)(lVar8 + uVar11 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar5 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    if (bVar5) {
      __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }